

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetRuntimeDllsNode::Evaluate
          (string *__return_storage_ptr__,TargetRuntimeDllsNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  bool bVar1;
  TargetType TVar2;
  const_reference name;
  cmGeneratorTarget *this_00;
  ostream *poVar3;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  allocator<char> local_461;
  string_view local_460;
  string_view local_450;
  undefined1 local_440 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> loc;
  cmGeneratorTarget **dll;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range2;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *dlls;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dllPaths;
  cmComputeLinkInformation *cli;
  string local_3b0;
  ostringstream local_390 [8];
  ostringstream e_1;
  undefined1 local_210 [4];
  TargetType type;
  string local_1f0;
  ostringstream local_1c0 [8];
  ostringstream e;
  cmGeneratorTarget *gt;
  string *tgtName;
  cmGeneratorExpressionDAGChecker *param_4_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetRuntimeDllsNode *this_local;
  
  name = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::front(parameters);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,name);
  if (this_00 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar3 = std::operator<<((ostream *)local_1c0,"Objects of target \"");
    poVar3 = std::operator<<(poVar3,(string *)name);
    std::operator<<(poVar3,"\" referenced but no such target exists.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1f0,content);
    std::__cxx11::ostringstream::str();
    reportError(context,&local_1f0,(string *)local_210);
    std::__cxx11::string::~string((string *)local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if (((TVar2 == EXECUTABLE) || (TVar2 == SHARED_LIBRARY)) || (TVar2 == MODULE_LIBRARY)) {
      dllPaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)cmGeneratorTarget::GetLinkInformation(this_00,&context->Config);
      if ((cmComputeLinkInformation *)
          dllPaths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == (cmComputeLinkInformation *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_461);
        std::allocator<char>::~allocator(&local_461);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dlls);
        this_01 = cmComputeLinkInformation::GetRuntimeDLLs
                            ((cmComputeLinkInformation *)
                             dllPaths.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __end2 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::begin(this_01);
        dll = (cmGeneratorTarget **)
              std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              end(this_01);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                           *)&dll), bVar1) {
          loc.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_8_ = __gnu_cxx::
                    __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                    ::operator*(&__end2);
          cmGeneratorTarget::MaybeGetLocation
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_440,
                     *(cmGeneratorTarget **)
                      loc.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._32_8_,&context->Config);
          bVar1 = std::optional::operator_cast_to_bool((optional *)local_440);
          if (bVar1) {
            __args = std::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_440);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dlls,
                       __args);
          }
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_440);
          __gnu_cxx::
          __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
          ::operator++(&__end2);
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_450,";");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_460);
        cmJoin(__return_storage_ptr__,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&dlls,local_450,local_460);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dlls);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_390);
      poVar3 = std::operator<<((ostream *)local_390,"Objects of target \"");
      poVar3 = std::operator<<(poVar3,(string *)name);
      poVar3 = std::operator<<(poVar3,"\" referenced but is not one of the allowed target types ");
      std::operator<<(poVar3,"(EXECUTABLE, SHARED, MODULE).");
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_3b0,content);
      std::__cxx11::ostringstream::str();
      reportError(context,&local_3b0,(string *)&cli);
      std::__cxx11::string::~string((string *)&cli);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::ostringstream::~ostringstream(local_390);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::string const& tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }
    cmStateEnums::TargetType type = gt->GetType();
    if (type != cmStateEnums::EXECUTABLE &&
        type != cmStateEnums::SHARED_LIBRARY &&
        type != cmStateEnums::MODULE_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not one of the allowed target types "
        << "(EXECUTABLE, SHARED, MODULE).";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }

    if (auto* cli = gt->GetLinkInformation(context->Config)) {
      std::vector<std::string> dllPaths;
      auto const& dlls = cli->GetRuntimeDLLs();

      for (auto const& dll : dlls) {
        if (auto loc = dll->MaybeGetLocation(context->Config)) {
          dllPaths.emplace_back(*loc);
        }
      }

      return cmJoin(dllPaths, ";");
    }

    return "";
  }